

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

int __thiscall QInputDialog::open(QInputDialog *this,char *__file,int __oflag,...)

{
  long lVar1;
  int *piVar2;
  QObject *pQVar3;
  undefined8 uVar4;
  int __oflag_00;
  long in_FS_OFFSET;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar3 = (QObject *)signalForMember(___oflag);
  uVar4 = 0;
  QObject::connect(local_40,(char *)this,pQVar3,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  if (__file != (char *)0x0) {
    uVar4 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)__file);
  }
  piVar2 = *(int **)(lVar1 + 0x350);
  *(undefined8 *)(lVar1 + 0x350) = uVar4;
  *(char **)(lVar1 + 0x358) = __file;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  QByteArray::operator=((QByteArray *)(lVar1 + 0x360),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::open(QObject *receiver, const char *member)
{
    Q_D(QInputDialog);
    connect(this, signalForMember(member), receiver, member);
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}